

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eager_singletons.cpp
# Opt level: O0

int main(void)

{
  i args;
  i *__return_storage_ptr__;
  int *piVar1;
  anon_class_1_0_00000001 *in_RSI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 local_18 [8];
  i injector;
  
  injector.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<int,_int,_int>.object_ = (scope<int,_int,_int>)0;
  __return_storage_ptr__ = anon_class_1_0_00000001::operator()((i *)&configuration,in_RSI);
  args.super_injector_t._4_8_ = __return_storage_ptr__;
  args.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  ._0_4_ = in_stack_ffffffffffffffd8;
  local_18 = (undefined1  [8])
             boost::ext::di::v1_3_0::make_injector<boost::ext::di::v1_3_0::config,_i,_0,_0>
                       ((i *)__return_storage_ptr__,args);
  piVar1 = implementation::ctor_calls();
  if (*piVar1 != 0) {
    __assert_fail("0 == implementation::ctor_calls()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/eager_singletons.cpp"
                  ,0x4a,"int main()");
  }
  eager_singletons<i>((i *)local_18);
  piVar1 = implementation::ctor_calls();
  if (*piVar1 == 1) {
    boost::ext::di::v1_3_0::core::
    injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
    ::create<example,_0>
              ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
                *)local_18);
    piVar1 = implementation::ctor_calls();
    if (*piVar1 == 1) {
      return (int)injector.super_injector_t.
                  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
                  .
                  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                  .super_scope<int,_int,_int>.object_;
    }
    __assert_fail("1 == implementation::ctor_calls()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/eager_singletons.cpp"
                  ,0x52,"int main()");
  }
  __assert_fail("1 == implementation::ctor_calls()",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/eager_singletons.cpp"
                ,0x4e,"int main()");
}

Assistant:

int main() {
  /*<<make injector configuration>>*/
  auto injector = di::make_injector(configuration());
  assert(0 == implementation::ctor_calls());

  /*<<eagerly initialize singletons>>*/
  eager_singletons(injector);
  assert(1 == implementation::ctor_calls());

  /*<<create `example` with already initialized singletons>>*/
  injector.create<example>();
  assert(1 == implementation::ctor_calls());
}